

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDAGetQuadSensErrWeights(void *ida_mem,N_Vector *eQSweight)

{
  int line;
  int error_code;
  char *msgfmt;
  ulong uVar1;
  ulong uVar2;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x731;
  }
  else {
    if (*(int *)((long)ida_mem + 0x110) != 0) {
      if (*(int *)((long)ida_mem + 300) != 0) {
        uVar1 = (ulong)*(uint *)((long)ida_mem + 0xa0);
        if ((int)*(uint *)((long)ida_mem + 0xa0) < 1) {
          uVar1 = 0;
        }
        for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
          N_VScale(0x3ff0000000000000,*(undefined8 *)(*(long *)((long)ida_mem + 0x430) + uVar2 * 8),
                   eQSweight[uVar2]);
        }
        return 0;
      }
      return 0;
    }
    msgfmt = "Forward sensitivity analysis for quadrature variables was not activated.";
    error_code = -0x32;
    line = 0x739;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetQuadSensErrWeights",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAGetQuadSensErrWeights(void* ida_mem, N_Vector* eQSweight)
{
  IDAMem IDA_mem;
  int is, Ns;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadr_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    return (IDA_NO_QUADSENS);
  }
  Ns = IDA_mem->ida_Ns;

  if (IDA_mem->ida_errconQS)
  {
    for (is = 0; is < Ns; is++)
    {
      N_VScale(ONE, IDA_mem->ida_ewtQS[is], eQSweight[is]);
    }
  }

  return (IDA_SUCCESS);
}